

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzma_encoder.c
# Opt level: O0

void literal_matched(lzma_range_encoder *rc,probability *subcoder,uint32_t match_byte,
                    uint32_t symbol)

{
  uint uVar1;
  uint32_t bit;
  uint32_t subcoder_index;
  uint32_t match_bit;
  uint32_t offset;
  uint32_t symbol_local;
  uint32_t match_byte_local;
  probability *subcoder_local;
  lzma_range_encoder *rc_local;
  
  subcoder_index = 0x100;
  match_bit = symbol + 0x100;
  offset = match_byte;
  do {
    rc_bit(rc,subcoder + (subcoder_index + (offset << 1 & subcoder_index) + (match_bit >> 8)),
           match_bit >> 7 & 1);
    uVar1 = match_bit << 1;
    subcoder_index = ((offset ^ match_bit) << 1 ^ 0xffffffff) & subcoder_index;
    match_bit = uVar1;
    offset = offset << 1;
  } while (uVar1 < 0x10000);
  return;
}

Assistant:

static inline void
literal_matched(lzma_range_encoder *rc, probability *subcoder,
		uint32_t match_byte, uint32_t symbol)
{
	uint32_t offset = 0x100;
	symbol += UINT32_C(1) << 8;

	do {
		uint32_t match_bit;
		uint32_t subcoder_index;
		uint32_t bit;

		match_byte <<= 1;
		match_bit = match_byte & offset;
		subcoder_index = offset + match_bit + (symbol >> 8);
		bit = (symbol >> 7) & 1;
		rc_bit(rc, &subcoder[subcoder_index], bit);

		symbol <<= 1;
		offset &= ~(match_byte ^ symbol);

	} while (symbol < (UINT32_C(1) << 16));
}